

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O1

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logFileName,int flushInterval)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  FixedBuffer<4000000> *pFVar2;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_70;
  pthread_cond_t *local_68;
  Thread *local_60;
  string *local_58;
  string local_50;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  (this->basename_)._M_dataplus._M_p = (pointer)&(this->basename_).field_2;
  pcVar1 = (logFileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->basename_,pcVar1,pcVar1 + logFileName->_M_string_length);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_58 = &this->basename_;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(AsyncLogging **)((long)local_98._M_unused._0_8_ + 0x10) = this;
  pcStack_80 = std::
               _Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>::
               _M_invoke;
  local_88 = std::_Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>
             ::_M_manager;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Logging","");
  Thread::Thread(&this->thread_,(ThreadFunc *)&local_98,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  (this->cond_).mutex = &this->mutex_;
  local_68 = &(this->cond_).cond;
  pthread_cond_init((pthread_cond_t *)local_68,(pthread_condattr_t *)0x0);
  local_60 = &this->thread_;
  pFVar2 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar2->cur_ = (char *)pFVar2;
  (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pFVar2;
  this_00 = &(this->currentBuffer_).
             super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (this_00,pFVar2);
  local_70 = this_00;
  pFVar2 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar2->cur_ = (char *)pFVar2;
  (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pFVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&(this->nextBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pFVar2);
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CountDownLatch::CountDownLatch(&this->latch_,1);
  if (1 < logFileName->_M_string_length) {
    memset((this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,4000000);
    memset((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr,0,4000000);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logFileName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x18,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logFileName, int flushInterval)
        : flushInterval_(flushInterval),
        running_(false),
        basename_(logFileName),
        thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
        mutex_(),
        cond_(mutex_),
        currentBuffer_(new Buffer),
        nextBuffer_(new Buffer),
        buffers_(),
        latch_(1){
            assert(logFileName.size() > 1);
            currentBuffer_->bzero();
            nextBuffer_->bzero();
            buffers_.reserve(16);
}